

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsModuleCompiler::AddExport(AsmJsModuleCompiler *this,PropertyName name,RegSlot location)

{
  bool bVar1;
  int iVar2;
  ScriptContext *scriptContext;
  AsmJsModuleExport local_3c;
  AsmJsModuleExport ex;
  AsmJsModuleExport *foundExport;
  RegSlot location_local;
  PropertyName name_local;
  AsmJsModuleCompiler *this_local;
  
  ex.id = Ident::GetPropertyId(name);
  bVar1 = JsUtil::
          BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>(&this->mExports,&ex.id,(AsmJsModuleExport **)&ex.location);
  if (bVar1) {
    scriptContext = GetScriptContext(this);
    AsmJSCompiler::OutputMessage(scriptContext,DEIT_GENERAL,L"Warning: redefining export");
    *(RegSlot *)(stack0xffffffffffffffd0 + 4) = location;
    this_local._7_1_ = true;
  }
  else {
    local_3c.id = Ident::GetPropertyId(name);
    local_3c.location = location;
    iVar2 = JsUtil::
            BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Add(&this->mExports,&local_3c.id,&local_3c);
    this_local._7_1_ = -1 < iVar2;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsModuleCompiler::AddExport(PropertyName name, RegSlot location)
    {
        AsmJsModuleExport * foundExport;
        if (mExports.TryGetReference(name->GetPropertyId(), &foundExport))
        {
            AsmJSCompiler::OutputMessage(GetScriptContext(), DEIT_GENERAL, _u("Warning: redefining export"));
            foundExport->location = location;
            return true;
        }
        else
        {
            AsmJsModuleExport ex;
            ex.id = name->GetPropertyId();
            ex.location = location;
            return mExports.Add(ex.id, ex) >= 0;
            // return is < 0 if count overflowed 31bits
        }
    }